

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glApi.hpp
# Opt level: O2

void __thiscall
Program::setUniform<glm::mat<4,4,float,(glm::qualifier)0>>
          (Program *this,string *name,mat<4,_4,_float,_(glm::qualifier)0> *val)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  int location;
  int local_1c;
  
  bVar1 = getUniformLocation(this,name,&local_1c);
  if ((bVar1) && (bVar1 = bound(this), bVar1)) {
    uniformDispatcher<glm::mat<4,4,float,(glm::qualifier)0>>(local_1c,val);
    return;
  }
  bVar1 = bound(this);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"=====");
    poVar2 = std::operator<<(poVar2,(string *)name);
    pcVar3 = " uniform was queried but does not exist\n";
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"===== Program is not attached (for uniform \'");
    poVar2 = std::operator<<(poVar2,(string *)name);
    pcVar3 = "\')\n";
  }
  std::operator<<(poVar2,pcVar3);
  return;
}

Assistant:

void Program::setUniform(const std::string & name, const T & val) const
{
  int location;
  if (getUniformLocation(name, location) and bound()) {
    uniformDispatcher<T>(location, val);
  } else if (not bound()) {
    std::cerr << "===== Program is not attached (for uniform '" << name << "')\n";
  } else {
    std::cerr << "=====" << name << " uniform was queried but does not exist\n";
  }
}